

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::MapAndSetFuncExprScopeRegister(FunctionBody *this,RegSlot reg)

{
  code *pcVar1;
  bool bVar2;
  RegSlot val;
  undefined4 *puVar3;
  
  if ((this->field_0x17c & 0x80) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2628,"(!m_hasFuncExprScopeRegister)",
                                "!m_hasFuncExprScopeRegister");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  val = MapRegSlot(this,reg);
  if (val != 0xffffffff) {
    *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c | 0x80;
    SetCountField(this,FuncExprScopeRegister,val);
    return;
  }
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xff7f;
  return;
}

Assistant:

void FunctionBody::MapAndSetFuncExprScopeRegister(RegSlot reg)
    {
        Assert(!m_hasFuncExprScopeRegister);
        SetFuncExprScopeRegister(this->MapRegSlot(reg));
    }